

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O2

bool lzham::generate_polar_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  sym_freq_conflict *psVar6;
  uint i;
  ulong uVar7;
  long lVar8;
  sym_freq_conflict *psVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ushort *puVar13;
  undefined1 *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint hist [512];
  uint auStack_c38 [257];
  undefined1 local_834 [1020];
  uint local_438 [258];
  
  if (num_syms - 1 < 600) {
    uVar19 = 0;
    uVar15 = 0;
    for (uVar7 = 0; uVar18 = (uint)uVar19, num_syms != uVar7; uVar7 = uVar7 + 1) {
      uVar2 = pFreq[uVar7];
      if (uVar2 == 0) {
        pCodesizes[uVar7] = '\0';
      }
      else {
        uVar15 = uVar15 + uVar2;
        *(short *)((long)pContext + uVar19 * 4 + 2) = (short)uVar7;
        *(ushort *)((long)pContext + uVar19 * 4) = uVar2;
        uVar19 = (ulong)(uVar18 + 1);
      }
    }
    *total_freq_ret = uVar15;
    if (uVar18 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 2)] = '\x01';
    }
    else {
      memset(auStack_c38 + 0x100,0,0x800);
      uVar7 = (ulong)(uVar18 & 0xfffffffe);
      puVar13 = (ushort *)pContext;
      for (lVar8 = (ulong)(uVar18 & 0xfffffffe) << 2; lVar8 != 0; lVar8 = lVar8 + -8) {
        uVar2 = *puVar13;
        uVar3 = puVar13[2];
        auStack_c38[(ulong)(uVar2 & 0xff) + 0x100] = auStack_c38[(ulong)(uVar2 & 0xff) + 0x100] + 1;
        piVar1 = (int *)((long)local_438 + (ulong)(uVar2 >> 6 & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
        auStack_c38[(ulong)(uVar3 & 0xff) + 0x100] = auStack_c38[(ulong)(uVar3 & 0xff) + 0x100] + 1;
        piVar1 = (int *)((long)local_438 + (ulong)(uVar3 >> 6 & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
        puVar13 = puVar13 + 4;
      }
      if ((uVar19 & 1) != 0) {
        uVar2 = *(ushort *)((long)pContext + uVar7 * 4);
        auStack_c38[(ulong)(byte)uVar2 + 0x100] = auStack_c38[(ulong)(byte)uVar2 + 0x100] + 1;
        piVar1 = (int *)((long)local_438 + (ulong)(uVar2 >> 6 & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
      }
      puVar14 = local_834;
      psVar6 = (sym_freq_conflict *)((long)pContext + 0x960);
      for (lVar8 = 0; psVar9 = psVar6, lVar8 != (ulong)(local_438[0] != uVar18) + 1;
          lVar8 = lVar8 + 1) {
        uVar16 = 0;
        for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 2) {
          auStack_c38[uVar10] = uVar16;
          iVar4 = *(int *)(puVar14 + uVar10 * 4 + -4);
          auStack_c38[uVar10 + 1] = uVar16 + iVar4;
          uVar16 = uVar16 + iVar4 + *(int *)(puVar14 + uVar10 * 4);
        }
        for (lVar11 = 0; (ulong)(uVar18 & 0xfffffffe) << 2 != lVar11; lVar11 = lVar11 + 8) {
          uVar2 = *(ushort *)((long)&((sym_freq_conflict *)pContext)->m_freq + lVar11);
          uVar3 = *(ushort *)((long)&((sym_freq_conflict *)((long)pContext + 4))->m_freq + lVar11);
          uVar5 = uVar2 >> 8;
          if (lVar8 == 0) {
            uVar5 = uVar2;
          }
          uVar2 = uVar3 >> 8;
          if (lVar8 == 0) {
            uVar2 = uVar3;
          }
          uVar17 = uVar5 & 0xff;
          uVar12 = uVar2 & 0xff;
          uVar16 = auStack_c38[uVar17];
          if (uVar17 == uVar12) {
            auStack_c38[uVar17] = uVar16 + 2;
            psVar9[uVar16] =
                 *(sym_freq_conflict *)((long)&((sym_freq_conflict *)pContext)->m_freq + lVar11);
            uVar17 = uVar16 + 1;
          }
          else {
            auStack_c38[uVar17] = uVar16 + 1;
            uVar17 = auStack_c38[uVar12];
            auStack_c38[uVar12] = uVar17 + 1;
            psVar9[uVar16] =
                 *(sym_freq_conflict *)((long)&((sym_freq_conflict *)pContext)->m_freq + lVar11);
          }
          psVar9[uVar17] =
               *(sym_freq_conflict *)
                ((long)&((sym_freq_conflict *)((long)pContext + 4))->m_freq + lVar11);
        }
        if ((uVar19 & 1) != 0) {
          uVar12 = ((sym_freq_conflict *)((long)pContext + uVar7 * 4))->m_freq >>
                   ((char)lVar8 * '\b' & 0x1fU) & 0xff;
          uVar16 = auStack_c38[uVar12];
          auStack_c38[uVar12] = uVar16 + 1;
          psVar9[uVar16] = *(sym_freq_conflict *)((long)pContext + uVar7 * 4);
        }
        puVar14 = puVar14 + 0x400;
        psVar6 = (sym_freq_conflict *)pContext;
        pContext = psVar9;
      }
      generate_polar_codes(num_syms,(sym_freq_conflict *)pContext,pCodesizes,max_code_size);
    }
  }
  return num_syms - 1 < 600;
}

Assistant:

bool generate_polar_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cPolarMaxSupportedSyms))
         return false;

      polar_work_tables& state = *static_cast<polar_work_tables*>(pContext);;

      uint max_freq = 0;
      uint total_freq = 0;

      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];

         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);

            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_sym = static_cast<uint16>(i);
            sf.m_freq = static_cast<uint16>(freq);
            num_used_syms++;
         }            
      }

      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_sym] = 1;
      }
      else
      {
         sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
         
#if LZHAM_USE_SHANNON_FANO_CODES
         generate_shannon_fano_codes(num_syms, syms, total_freq, pCodesizes, max_code_size);
#elif LZHAM_USE_FYFFE_CODES         
         generate_fyffe_codes(num_syms, syms, pCodesizes, max_code_size);
#else
         generate_polar_codes(num_syms, syms, pCodesizes, max_code_size);
#endif         
      }

      return true;
   }